

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::MixMaterial::writeTo(MixMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  int32_t local_4c;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Material,void>
            (local_28,&(this->material0).
                       super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Material,void>
            (local_38,&(this->material1).
                       super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_38);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_48,&(this->map_amount).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_48);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->amount);
  return 0xd;
}

Assistant:

int MixMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(material0));
    binary.write(binary.serialize(material1));
    binary.write(binary.serialize(map_amount));
    binary.write(amount);
    return TYPE_MIX_MATERIAL;
  }